

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O2

void __thiscall mempool_tests::MempoolSizeLimitTest::test_method(MempoolSizeLimitTest *this)

{
  CTxMemPool *this_00;
  undefined7 uVar1;
  uchar uVar2;
  bool bVar3;
  readonly_property<bool> rVar4;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  CScript *pCVar7;
  size_t sVar8;
  int64_t iVar9;
  int64_t iVar10;
  iterator pvVar11;
  iterator pvVar12;
  CMutableTransaction *pCVar13;
  lazy_ostream *plVar14;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  check_type cVar15;
  CMutableTransaction *nFeePaid;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  lazy_ostream local_608;
  undefined1 *local_5f8;
  char **local_5f0;
  assertion_result local_5e8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  CMutableTransaction tx7;
  CMutableTransaction tx6;
  CMutableTransaction tx5;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  CFeeRate maxFeeRateRemoved;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  CMutableTransaction tx3;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  CMutableTransaction tx2;
  CMutableTransaction tx1;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  vtx;
  undefined8 uStack_1d0;
  CMutableTransaction tx4;
  undefined1 local_148 [32];
  uchar uStack_128;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
                      ,0x1b4,"test_method","m_node.mempool");
  this_00 = (puVar5->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
             ,0x1b5,false);
  pvVar11 = (iterator)0x1b5;
  pvVar12 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this_00->cs,"pool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp"
             ,0x1b5,false);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  CMutableTransaction::CMutableTransaction(&tx1);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx1.vin,1);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_1)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx1.vout,1);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_1);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  (tx1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = (CAmount)&DAT_3b9aca00;
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx1);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  CMutableTransaction::CMutableTransaction(&tx2);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx2.vin,1);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_2)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx2.vout,1);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_2);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  (tx2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = (CAmount)&DAT_3b9aca00;
  entry.nFee = 5000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  sVar8 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize(this_00,sVar8,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1c9;
  file.m_begin = (iterator)&local_2c8;
  msg.m_end = pvVar12;
  msg.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2d8,msg);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar3);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xbb3569;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3592;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2e0 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar15,(size_t)&local_2e8,0x1c9
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1ca;
  file_00.m_begin = (iterator)&local_2f8;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_308,
             msg_00);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar3);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xbb353e;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3567;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_310 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar15,(size_t)&local_318,0x1ca
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar8 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize
            (this_00,sVar8 * 3 >> 2,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1cd;
  file_01.m_begin = (iterator)&local_328;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
             msg_01);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar3);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xbb3569;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3592;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_340 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar15,(size_t)&local_348,0x1cd
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1ce;
  file_02.m_begin = (iterator)&local_358;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_368,
             msg_02);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar3);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_84b606;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3567;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_370 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx5,(lazy_ostream *)&tx3,1,0,WARN,_cVar15,(size_t)&local_378,0x1ce
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx2);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  CMutableTransaction::CMutableTransaction(&tx3);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx3.vin,1);
  CMutableTransaction::GetHash((Txid *)local_148,&tx2);
  *(ulong *)(((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_148._17_7_,local_148[0x10]);
  *(ulong *)(((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) = CONCAT71(local_148._25_7_,local_148[0x18]);
  *(ulong *)((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_148._1_7_,local_148[0]);
  *(ulong *)(((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_148._9_7_,local_148[8]);
  ((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_2)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx3.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx3.vout,1);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_3);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  (tx3.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = (CAmount)&DAT_3b9aca00;
  entry.nFee = 20000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx3);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  sVar8 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize
            (this_00,sVar8 * 3 >> 2,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1db;
  file_03.m_begin = (iterator)&local_3c0;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3d0,
             msg_03);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar3);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_84b61e;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3592;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3d8 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar15,(size_t)&local_3e0,0x1db
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1dc;
  file_04.m_begin = (iterator)&local_3f0;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_400,
             msg_04);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar3);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xbb353e;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3567;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_408 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar15,(size_t)&local_410,0x1dc
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1dd;
  file_05.m_begin = (iterator)&local_420;
  msg_05.m_end = pvVar12;
  msg_05.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_430,
             msg_05);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx3);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar3);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0xbb3594;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb35bd;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_438 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar15,(size_t)&local_440,0x1dd
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CTransaction::CTransaction((CTransaction *)local_148,&tx1);
  sVar8 = GetVirtualTransactionSize((CTransaction *)local_148);
  CTxMemPool::TrimToSize(this_00,sVar8,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  CTransaction::~CTransaction((CTransaction *)local_148);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1e0;
  file_06.m_begin = (iterator)&local_450;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_460,
             msg_06);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx1);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar3);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_84b61e;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3592;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_468 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar15,(size_t)&local_470,0x1e0
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1e1;
  file_07.m_begin = (iterator)&local_480;
  msg_07.m_end = pvVar12;
  msg_07.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_490,
             msg_07);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx2);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar3);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_84b606;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb3567;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_498 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar15,(size_t)&local_4a0,0x1e1
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1e2;
  file_08.m_begin = (iterator)&local_4b0;
  msg_08.m_end = pvVar12;
  msg_08.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4c0,
             msg_08);
  CMutableTransaction::GetHash((Txid *)&tx4,&tx3);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ =
       SUB87(tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start,0);
  uStack_128 = (uchar)((ulong)tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x38);
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,!bVar3);
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)anon_var_dwarf_84b636;
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbb35bd;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4c8 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tx7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx6,(lazy_ostream *)&tx5,1,0,WARN,_cVar15,(size_t)&local_4d0,0x1e2
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x61a8;
  CTransaction::CTransaction((CTransaction *)local_148,&tx3);
  iVar9 = GetVirtualTransactionSize((CTransaction *)local_148);
  CTransaction::CTransaction((CTransaction *)&tx4,&tx2);
  iVar10 = GetVirtualTransactionSize((CTransaction *)&tx4);
  nFeePaid = &tx5;
  CFeeRate::CFeeRate(&maxFeeRateRemoved,(CAmount *)nFeePaid,(int)iVar10 + (int)iVar9);
  CTransaction::~CTransaction((CTransaction *)&tx4);
  CTransaction::~CTransaction((CTransaction *)local_148);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1e5;
  file_09.m_begin = (iterator)&local_4e8;
  msg_09.m_end = pvVar12;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4f8,
             msg_09);
  local_148[8] = '\0';
  local_148[0] = -0x50;
  local_148._1_7_ = 0x11480;
  local_148[0x10] = '@';
  local_148._17_7_ = 0x115c1;
  local_148[0x18] = -0x34;
  local_148._25_7_ = 0xc7f1;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_500 = "";
  tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CTxMemPool::GetMinFee(this_00,1);
  pCVar13 = &tx4;
  tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)(maxFeeRateRemoved.nSatoshisPerK + 1000);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_148,&local_508,0x1e5,1,2,pCVar13,"pool.GetMinFee(1).GetFeePerK()",nFeePaid,
             "maxFeeRateRemoved.GetFeePerK() + 1000");
  CMutableTransaction::CMutableTransaction(&tx4);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx4.vin,2);
  COutPoint::SetNull(&(tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_4)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  COutPoint::SetNull(&tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start[1].prevout);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_4)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx4.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx4.vout,2);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_4);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  (tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = (CAmount)&DAT_3b9aca00;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_4);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  tx4.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = (CAmount)&DAT_3b9aca00;
  CMutableTransaction::CMutableTransaction(&tx5);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx5.vin,2);
  CMutableTransaction::GetHash((Txid *)local_148,&tx4);
  *(ulong *)(((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_148._17_7_,local_148[0x10]);
  *(ulong *)(((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) = CONCAT71(local_148._25_7_,local_148[0x18]);
  *(ulong *)((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_148._1_7_,local_148[0]);
  *(ulong *)(((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_148._9_7_,local_148[8]);
  ((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_4)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  COutPoint::SetNull(&tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start[1].prevout);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_5)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx5.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx5.vout,2);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_5);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  (tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = (CAmount)&DAT_3b9aca00;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_5);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  tx5.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = (CAmount)&DAT_3b9aca00;
  CMutableTransaction::CMutableTransaction(&tx6);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx6.vin,2);
  CMutableTransaction::GetHash((Txid *)local_148,&tx4);
  *(ulong *)(((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_148._17_7_,local_148[0x10]);
  *(ulong *)(((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) = CONCAT71(local_148._25_7_,local_148[0x18]);
  *(ulong *)((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_148._1_7_,local_148[0]);
  *(ulong *)(((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_148._9_7_,local_148[8]);
  ((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 1;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_4)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  COutPoint::SetNull(&tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start[1].prevout);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_6)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx6.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx6.vout,2);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_6);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  (tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = (CAmount)&DAT_3b9aca00;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_6);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  tx6.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = (CAmount)&DAT_3b9aca00;
  CMutableTransaction::CMutableTransaction(&tx7);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&tx7.vin,2);
  CMutableTransaction::GetHash((Txid *)local_148,&tx5);
  *(ulong *)(((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10) = CONCAT71(local_148._17_7_,local_148[0x10]);
  *(ulong *)(((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x18) = CONCAT71(local_148._25_7_,local_148[0x18]);
  *(ulong *)((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems = CONCAT71(local_148._1_7_,local_148[0]);
  *(ulong *)(((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8) = CONCAT71(local_148._9_7_,local_148[8]);
  ((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_5)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  CMutableTransaction::GetHash((Txid *)local_148,&tx6);
  *(ulong *)(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data
             ._M_elems + 0x10) = CONCAT71(local_148._17_7_,local_148[0x10]);
  *(ulong *)(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data
             ._M_elems + 0x18) = CONCAT71(local_148._25_7_,local_148[0x18]);
  *(ulong *)tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data.
            _M_elems = CONCAT71(local_148._1_7_,local_148[0]);
  *(ulong *)(tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start[1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data
             ._M_elems + 8) = CONCAT71(local_148._9_7_,local_148[8]);
  tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  [1].prevout.n = 0;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  ppVar6 = &CScript::operator<<((CScript *)local_148,OP_6)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx7.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptSig.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx7.vout,2);
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_7);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  (tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = (CAmount)&DAT_3b9aca00;
  local_148[0x10] = '\0';
  local_148._17_7_ = 0;
  local_148[0x18] = '\0';
  local_148._25_7_ = 0;
  local_148[0] = '\0';
  local_148._1_7_ = 0;
  local_148[8] = '\0';
  local_148._9_7_ = 0;
  pCVar7 = CScript::operator<<((CScript *)local_148,OP_7);
  ppVar6 = &CScript::operator<<(pCVar7,OP_EQUAL)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,ppVar6);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  tx7.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = (CAmount)&DAT_3b9aca00;
  entry.nFee = 7000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx4);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  entry.nFee = 1000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  entry.nFee = 0x44c;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx6);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  entry.nFee = 9000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  sVar8 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize(this_00,sVar8 - 1,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x21e;
  file_10.m_begin = (iterator)&local_5c0;
  msg_10.m_end = (iterator)pCVar13;
  msg_10.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5d0,
             msg_10);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx4);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = (undefined7)uStack_1d0;
  uVar1 = local_148._25_7_;
  uStack_128 = SUB81(uStack_1d0,7);
  uVar2 = uStack_128;
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_148);
  local_5e8.m_message.px = (element_type *)0x0;
  local_5e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = "pool.exists(GenTxid::Txid(tx4.GetHash()))";
  local_610 = "";
  local_608.m_empty = false;
  local_608._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_5f8 = boost::unit_test::lazy_ostream::inst;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_620 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_5f0 = &local_618;
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_5e8,&local_608,1,0,WARN,(check_type)nFeePaid,(size_t)&local_628,0x21e);
  boost::detail::shared_count::~shared_count(&local_5e8.m_message.pn);
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x21f;
  file_11.m_begin = (iterator)&local_638;
  msg_11.m_end = pvVar12;
  msg_11.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_648,
             msg_11);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx6);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = uVar1;
  uStack_128 = uVar2;
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_148);
  local_5e8.m_message.px = (element_type *)0x0;
  local_5e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = "pool.exists(GenTxid::Txid(tx6.GetHash()))";
  local_610 = "";
  local_608.m_empty = false;
  local_608._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_5f8 = boost::unit_test::lazy_ostream::inst;
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_650 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_5f0 = &local_618;
  boost::test_tools::tt_detail::report_assertion
            (&local_5e8,&local_608,1,0,WARN,(check_type)nFeePaid,(size_t)&local_658,0x21f);
  boost::detail::shared_count::~shared_count(&local_5e8.m_message.pn);
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x220;
  file_12.m_begin = (iterator)&local_668;
  msg_12.m_end = pvVar12;
  msg_12.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_678,
             msg_12);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx7);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = uVar1;
  uStack_128 = uVar2;
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_5e8.m_message.px = (element_type *)0x0;
  local_5e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = "!pool.exists(GenTxid::Txid(tx7.GetHash()))";
  local_610 = "";
  local_608.m_empty = false;
  local_608._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_5f8 = boost::unit_test::lazy_ostream::inst;
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_680 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_5f0 = &local_618;
  boost::test_tools::tt_detail::report_assertion
            (&local_5e8,&local_608,1,0,WARN,(check_type)nFeePaid,(size_t)&local_688,0x220);
  boost::detail::shared_count::~shared_count(&local_5e8.m_message.pn);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx5);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = uVar1;
  uStack_128 = uVar2;
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  if (!bVar3) {
    entry.nFee = 1000;
    TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx5);
    CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  }
  entry.nFee = 9000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  sVar8 = CTxMemPool::DynamicMemoryUsage(this_00);
  CTxMemPool::TrimToSize(this_00,sVar8 >> 1,(vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_690 = "";
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x227;
  file_13.m_begin = (iterator)&local_698;
  msg_13.m_end = pvVar12;
  msg_13.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_6a8,
             msg_13);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx4);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = uVar1;
  uStack_128 = uVar2;
  rVar4.super_class_property<bool>.value =
       (class_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_148);
  local_5e8.m_message.px = (element_type *)0x0;
  local_5e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = "pool.exists(GenTxid::Txid(tx4.GetHash()))";
  local_610 = "";
  local_608.m_empty = false;
  local_608._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_5f8 = boost::unit_test::lazy_ostream::inst;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6b0 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_5f0 = &local_618;
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_5e8,&local_608,1,0,WARN,(check_type)nFeePaid,(size_t)&local_6b8,0x227);
  boost::detail::shared_count::~shared_count(&local_5e8.m_message.pn);
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x228;
  file_14.m_begin = (iterator)&local_6c8;
  msg_14.m_end = pvVar12;
  msg_14.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6d8,
             msg_14);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx5);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = uVar1;
  uStack_128 = uVar2;
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_5e8.m_message.px = (element_type *)0x0;
  local_5e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = "!pool.exists(GenTxid::Txid(tx5.GetHash()))";
  local_610 = "";
  local_608.m_empty = false;
  local_608._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_5f8 = boost::unit_test::lazy_ostream::inst;
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6e0 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_5f0 = &local_618;
  boost::test_tools::tt_detail::report_assertion
            (&local_5e8,&local_608,1,0,WARN,(check_type)nFeePaid,(size_t)&local_6e8,0x228);
  boost::detail::shared_count::~shared_count(&local_5e8.m_message.pn);
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_6f0 = "";
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x229;
  file_15.m_begin = (iterator)&local_6f8;
  msg_15.m_end = pvVar12;
  msg_15.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_708,
             msg_15);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx6);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = uVar1;
  uStack_128 = uVar2;
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CTxMemPool::exists(this_00,(GenTxid *)local_148);
  local_5e8.m_message.px = (element_type *)0x0;
  local_5e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = "pool.exists(GenTxid::Txid(tx6.GetHash()))";
  local_610 = "";
  local_608.m_empty = false;
  local_608._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_5f8 = boost::unit_test::lazy_ostream::inst;
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_710 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_5f0 = &local_618;
  boost::test_tools::tt_detail::report_assertion
            (&local_5e8,&local_608,1,0,WARN,(check_type)nFeePaid,(size_t)&local_718,0x229);
  boost::detail::shared_count::~shared_count(&local_5e8.m_message.pn);
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_720 = "";
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x22a;
  file_16.m_begin = (iterator)&local_728;
  msg_16.m_end = pvVar12;
  msg_16.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_738,
             msg_16);
  CMutableTransaction::GetHash((Txid *)&vtx,&tx7);
  local_148[0] = '\0';
  local_148._1_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_148[8] = (undefined1)
                 ((ulong)vtx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  local_148._9_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0);
  local_148[0x10] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish >> 0x38);
  local_148._17_7_ =
       SUB87(vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_148[0x18] =
       (undefined1)
       ((ulong)vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
  local_148._25_7_ = uVar1;
  uStack_128 = uVar2;
  bVar3 = CTxMemPool::exists(this_00,(GenTxid *)local_148);
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_5e8.m_message.px = (element_type *)0x0;
  local_5e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_618 = "!pool.exists(GenTxid::Txid(tx7.GetHash()))";
  local_610 = "";
  local_608.m_empty = false;
  local_608._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_5f8 = boost::unit_test::lazy_ostream::inst;
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_740 = "";
  pvVar11 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_5f0 = &local_618;
  boost::test_tools::tt_detail::report_assertion
            (&local_5e8,&local_608,1,0,WARN,(check_type)nFeePaid,(size_t)&local_748,0x22a);
  boost::detail::shared_count::~shared_count(&local_5e8.m_message.pn);
  entry.nFee = 1000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx5);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  entry.nFee = 9000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)local_148,&entry,&tx7);
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_148);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)local_148);
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetMockTime(0x2a);
  SetMockTime(0xa8ea);
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x232;
  file_17.m_begin = (iterator)&local_758;
  msg_17.m_end = pvVar12;
  msg_17.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_768,
             msg_17);
  local_148[8] = '\0';
  local_148[0] = -0x50;
  local_148._1_7_ = 0x11480;
  local_148[0x10] = '@';
  local_148._17_7_ = 0x115c1;
  local_148[0x18] = -0x34;
  local_148._25_7_ = 0xc7f1;
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_770 = "";
  local_608._vptr_lazy_ostream = (_func_int **)CTxMemPool::GetMinFee(this_00,1);
  plVar14 = &local_608;
  local_5e8._0_8_ = maxFeeRateRemoved.nSatoshisPerK + 1000;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_148,&local_778,0x232,1,2,plVar14,"pool.GetMinFee(1).GetFeePerK()",&local_5e8,
             "maxFeeRateRemoved.GetFeePerK() + 1000");
  CTxMemPool::removeForBlock(this_00,&vtx,1);
  SetMockTime(0x151aa);
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x236;
  file_18.m_begin = (iterator)&local_788;
  msg_18.m_end = (iterator)plVar14;
  msg_18.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_798,
             msg_18);
  local_148[8] = '\0';
  local_148[0] = -0x50;
  local_148._1_7_ = 0x11480;
  local_148[0x10] = '@';
  local_148._17_7_ = 0x115c1;
  local_148[0x18] = -0x34;
  local_148._25_7_ = 0xc7f1;
  local_7a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_7a0 = "";
  local_608._vptr_lazy_ostream = (_func_int **)CTxMemPool::GetMinFee(this_00,1);
  plVar14 = &local_608;
  local_5e8._0_8_ = llround((double)(maxFeeRateRemoved.nSatoshisPerK + 1000) * 0.5);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_148,&local_7a8,0x236,1,2,plVar14,"pool.GetMinFee(1).GetFeePerK()",&local_5e8,
             "llround((maxFeeRateRemoved.GetFeePerK() + 1000)/2.0)");
  SetMockTime(0x1a60a);
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x23a;
  file_19.m_begin = (iterator)&local_7b8;
  msg_19.m_end = (iterator)plVar14;
  msg_19.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_7c8,
             msg_19);
  local_148[8] = '\0';
  local_148[0] = -0x50;
  local_148._1_7_ = 0x11480;
  local_148[0x10] = '@';
  local_148._17_7_ = 0x115c1;
  local_148[0x18] = -0x34;
  local_148._25_7_ = 0xc7f1;
  local_7d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_7d0 = "";
  sVar8 = CTxMemPool::DynamicMemoryUsage(this_00);
  local_608._vptr_lazy_ostream = (_func_int **)CTxMemPool::GetMinFee(this_00,sVar8 * 5 >> 1);
  plVar14 = &local_608;
  local_5e8._0_8_ = llround((double)(maxFeeRateRemoved.nSatoshisPerK + 1000) * 0.25);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_148,&local_7d8,0x23a,1,2,plVar14,
             "pool.GetMinFee(pool.DynamicMemoryUsage() * 5 / 2).GetFeePerK()",&local_5e8,
             "llround((maxFeeRateRemoved.GetFeePerK() + 1000)/4.0)");
  SetMockTime(0x1d03a);
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x23e;
  file_20.m_begin = (iterator)&local_7e8;
  msg_20.m_end = (iterator)plVar14;
  msg_20.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_7f8,
             msg_20);
  local_148[8] = '\0';
  local_148[0] = -0x50;
  local_148._1_7_ = 0x11480;
  local_148[0x10] = '@';
  local_148._17_7_ = 0x115c1;
  local_148[0x18] = -0x34;
  local_148._25_7_ = 0xc7f1;
  local_808 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_800 = "";
  sVar8 = CTxMemPool::DynamicMemoryUsage(this_00);
  local_608._vptr_lazy_ostream = (_func_int **)CTxMemPool::GetMinFee(this_00,sVar8 * 9 >> 1);
  plVar14 = &local_608;
  local_5e8._0_8_ = llround((double)(maxFeeRateRemoved.nSatoshisPerK + 1000) * 0.125);
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_148,&local_808,0x23e,1,2,plVar14,
             "pool.GetMinFee(pool.DynamicMemoryUsage() * 9 / 2).GetFeePerK()",&local_5e8,
             "llround((maxFeeRateRemoved.GetFeePerK() + 1000)/8.0)");
  SetMockTime(0x51bfa);
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x242;
  file_21.m_begin = (iterator)&local_818;
  msg_21.m_end = (iterator)plVar14;
  msg_21.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_828,
             msg_21);
  local_148[8] = '\0';
  local_148[0] = -0x50;
  local_148._1_7_ = 0x11480;
  local_148[0x10] = '@';
  local_148._17_7_ = 0x115c1;
  local_148[0x18] = -0x34;
  local_148._25_7_ = 0xc7f1;
  local_838 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_830 = "";
  local_608._vptr_lazy_ostream = (_func_int **)CTxMemPool::GetMinFee(this_00,1);
  plVar14 = &local_608;
  local_5e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0xe8;
  local_5e8._1_3_ = 3;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_148,&local_838,0x242,1,2,plVar14,"pool.GetMinFee(1).GetFeePerK()",&local_5e8,
             "1000");
  SetMockTime(0x5c4ba);
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_840 = "";
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x246;
  file_22.m_begin = (iterator)&local_848;
  msg_22.m_end = (iterator)plVar14;
  msg_22.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_858,
             msg_22);
  local_148[8] = '\0';
  local_148[0] = -0x50;
  local_148._1_7_ = 0x11480;
  local_148[0x10] = '@';
  local_148._17_7_ = 0x115c1;
  local_148[0x18] = -0x34;
  local_148._25_7_ = 0xc7f1;
  local_868 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/mempool_tests.cpp";
  local_860 = "";
  local_608._vptr_lazy_ostream = (_func_int **)CTxMemPool::GetMinFee(this_00,1);
  local_5e8._0_8_ = (ulong)(uint)local_5e8._4_4_ << 0x20;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_148,&local_868,0x246,1,2,&local_608,"pool.GetMinFee(1).GetFeePerK()",&local_5e8,
             "0");
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&vtx);
  CMutableTransaction::~CMutableTransaction(&tx7);
  CMutableTransaction::~CMutableTransaction(&tx6);
  CMutableTransaction::~CMutableTransaction(&tx5);
  CMutableTransaction::~CMutableTransaction(&tx4);
  CMutableTransaction::~CMutableTransaction(&tx3);
  CMutableTransaction::~CMutableTransaction(&tx2);
  CMutableTransaction::~CMutableTransaction(&tx1);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolSizeLimitTest)
{
    auto& pool = static_cast<MemPoolTest&>(*Assert(m_node.mempool));
    LOCK2(cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    CMutableTransaction tx1 = CMutableTransaction();
    tx1.vin.resize(1);
    tx1.vin[0].scriptSig = CScript() << OP_1;
    tx1.vout.resize(1);
    tx1.vout[0].scriptPubKey = CScript() << OP_1 << OP_EQUAL;
    tx1.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(10000LL).FromTx(tx1));

    CMutableTransaction tx2 = CMutableTransaction();
    tx2.vin.resize(1);
    tx2.vin[0].scriptSig = CScript() << OP_2;
    tx2.vout.resize(1);
    tx2.vout[0].scriptPubKey = CScript() << OP_2 << OP_EQUAL;
    tx2.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(5000LL).FromTx(tx2));

    pool.TrimToSize(pool.DynamicMemoryUsage()); // should do nothing
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx2.GetHash())));

    pool.TrimToSize(pool.DynamicMemoryUsage() * 3 / 4); // should remove the lower-feerate transaction
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx2.GetHash())));

    pool.addUnchecked(entry.FromTx(tx2));
    CMutableTransaction tx3 = CMutableTransaction();
    tx3.vin.resize(1);
    tx3.vin[0].prevout = COutPoint(tx2.GetHash(), 0);
    tx3.vin[0].scriptSig = CScript() << OP_2;
    tx3.vout.resize(1);
    tx3.vout[0].scriptPubKey = CScript() << OP_3 << OP_EQUAL;
    tx3.vout[0].nValue = 10 * COIN;
    pool.addUnchecked(entry.Fee(20000LL).FromTx(tx3));

    pool.TrimToSize(pool.DynamicMemoryUsage() * 3 / 4); // tx3 should pay for tx2 (CPFP)
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx2.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx3.GetHash())));

    pool.TrimToSize(GetVirtualTransactionSize(CTransaction(tx1))); // mempool is limited to tx1's size in memory usage, so nothing fits
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx1.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx2.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx3.GetHash())));

    CFeeRate maxFeeRateRemoved(25000, GetVirtualTransactionSize(CTransaction(tx3)) + GetVirtualTransactionSize(CTransaction(tx2)));
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), maxFeeRateRemoved.GetFeePerK() + 1000);

    CMutableTransaction tx4 = CMutableTransaction();
    tx4.vin.resize(2);
    tx4.vin[0].prevout.SetNull();
    tx4.vin[0].scriptSig = CScript() << OP_4;
    tx4.vin[1].prevout.SetNull();
    tx4.vin[1].scriptSig = CScript() << OP_4;
    tx4.vout.resize(2);
    tx4.vout[0].scriptPubKey = CScript() << OP_4 << OP_EQUAL;
    tx4.vout[0].nValue = 10 * COIN;
    tx4.vout[1].scriptPubKey = CScript() << OP_4 << OP_EQUAL;
    tx4.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx5 = CMutableTransaction();
    tx5.vin.resize(2);
    tx5.vin[0].prevout = COutPoint(tx4.GetHash(), 0);
    tx5.vin[0].scriptSig = CScript() << OP_4;
    tx5.vin[1].prevout.SetNull();
    tx5.vin[1].scriptSig = CScript() << OP_5;
    tx5.vout.resize(2);
    tx5.vout[0].scriptPubKey = CScript() << OP_5 << OP_EQUAL;
    tx5.vout[0].nValue = 10 * COIN;
    tx5.vout[1].scriptPubKey = CScript() << OP_5 << OP_EQUAL;
    tx5.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx6 = CMutableTransaction();
    tx6.vin.resize(2);
    tx6.vin[0].prevout = COutPoint(tx4.GetHash(), 1);
    tx6.vin[0].scriptSig = CScript() << OP_4;
    tx6.vin[1].prevout.SetNull();
    tx6.vin[1].scriptSig = CScript() << OP_6;
    tx6.vout.resize(2);
    tx6.vout[0].scriptPubKey = CScript() << OP_6 << OP_EQUAL;
    tx6.vout[0].nValue = 10 * COIN;
    tx6.vout[1].scriptPubKey = CScript() << OP_6 << OP_EQUAL;
    tx6.vout[1].nValue = 10 * COIN;

    CMutableTransaction tx7 = CMutableTransaction();
    tx7.vin.resize(2);
    tx7.vin[0].prevout = COutPoint(tx5.GetHash(), 0);
    tx7.vin[0].scriptSig = CScript() << OP_5;
    tx7.vin[1].prevout = COutPoint(tx6.GetHash(), 0);
    tx7.vin[1].scriptSig = CScript() << OP_6;
    tx7.vout.resize(2);
    tx7.vout[0].scriptPubKey = CScript() << OP_7 << OP_EQUAL;
    tx7.vout[0].nValue = 10 * COIN;
    tx7.vout[1].scriptPubKey = CScript() << OP_7 << OP_EQUAL;
    tx7.vout[1].nValue = 10 * COIN;

    pool.addUnchecked(entry.Fee(7000LL).FromTx(tx4));
    pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(1100LL).FromTx(tx6));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    // we only require this to remove, at max, 2 txn, because it's not clear what we're really optimizing for aside from that
    pool.TrimToSize(pool.DynamicMemoryUsage() - 1);
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx4.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx6.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx7.GetHash())));

    if (!pool.exists(GenTxid::Txid(tx5.GetHash())))
        pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    pool.TrimToSize(pool.DynamicMemoryUsage() / 2); // should maximize mempool size by only removing 5/7
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx4.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx5.GetHash())));
    BOOST_CHECK(pool.exists(GenTxid::Txid(tx6.GetHash())));
    BOOST_CHECK(!pool.exists(GenTxid::Txid(tx7.GetHash())));

    pool.addUnchecked(entry.Fee(1000LL).FromTx(tx5));
    pool.addUnchecked(entry.Fee(9000LL).FromTx(tx7));

    std::vector<CTransactionRef> vtx;
    SetMockTime(42);
    SetMockTime(42 + CTxMemPool::ROLLING_FEE_HALFLIFE);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), maxFeeRateRemoved.GetFeePerK() + 1000);
    // ... we should keep the same min fee until we get a block
    pool.removeForBlock(vtx, 1);
    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/2.0));
    // ... then feerate should drop 1/2 each halflife

    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2);
    BOOST_CHECK_EQUAL(pool.GetMinFee(pool.DynamicMemoryUsage() * 5 / 2).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/4.0));
    // ... with a 1/2 halflife when mempool is < 1/2 its target size

    SetMockTime(42 + 2*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(pool.DynamicMemoryUsage() * 9 / 2).GetFeePerK(), llround((maxFeeRateRemoved.GetFeePerK() + 1000)/8.0));
    // ... with a 1/4 halflife when mempool is < 1/4 its target size

    SetMockTime(42 + 7*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), 1000);
    // ... but feerate should never drop below 1000

    SetMockTime(42 + 8*CTxMemPool::ROLLING_FEE_HALFLIFE + CTxMemPool::ROLLING_FEE_HALFLIFE/2 + CTxMemPool::ROLLING_FEE_HALFLIFE/4);
    BOOST_CHECK_EQUAL(pool.GetMinFee(1).GetFeePerK(), 0);
    // ... unless it has gone all the way to 0 (after getting past 1000/2)
}